

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3OsOpenMalloc(sqlite3_vfs *pVfs,char *zFile,sqlite3_file **ppFile,int flags,int *pOutFlags
                       )

{
  int iVar1;
  sqlite3_file *p;
  int iVar2;
  
  p = (sqlite3_file *)sqlite3MallocZero((long)pVfs->szOsFile);
  if (p == (sqlite3_file *)0x0) {
    iVar2 = 7;
    p = (sqlite3_file *)0x0;
  }
  else {
    iVar1 = (*pVfs->xOpen)(pVfs,zFile,p,flags & 0x1087f7f,pOutFlags);
    iVar2 = 0;
    if (iVar1 != 0) {
      sqlite3_free(p);
      p = (sqlite3_file *)0x0;
      iVar2 = iVar1;
    }
  }
  *ppFile = p;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3OsOpenMalloc(
  sqlite3_vfs *pVfs,
  const char *zFile,
  sqlite3_file **ppFile,
  int flags,
  int *pOutFlags
){
  int rc;
  sqlite3_file *pFile;
  pFile = (sqlite3_file *)sqlite3MallocZero(pVfs->szOsFile);
  if( pFile ){
    rc = sqlite3OsOpen(pVfs, zFile, pFile, flags, pOutFlags);
    if( rc!=SQLITE_OK ){
      sqlite3_free(pFile);
      *ppFile = 0;
    }else{
      *ppFile = pFile;
    }
  }else{
    *ppFile = 0;
    rc = SQLITE_NOMEM_BKPT;
  }
  assert( *ppFile!=0 || rc!=SQLITE_OK );
  return rc;
}